

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,RefToken *tok)

{
  int iVar1;
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  *this_00;
  Token *pTVar2;
  reference pppVar3;
  AST *pAVar4;
  TokenRefCount<antlr::Token> *in_RDX;
  long in_RSI;
  ASTRef *in_RDI;
  RefAST *t;
  ASTRef *other;
  undefined1 local_38 [31];
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = (vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
             *)(in_RSI + 0x18);
  other = in_RDI;
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RDX);
  iVar1 = (*pTVar2->_vptr_Token[6])();
  pppVar3 = std::
            vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ::operator[](this_00,(long)iVar1);
  (*(*pppVar3)->second)(in_RDI);
  pAVar4 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDI);
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)this_00,(TokenRefCount<antlr::Token> *)other);
  (*pAVar4->_vptr_AST[0x13])(pAVar4,local_38);
  TokenRefCount<antlr::Token>::~TokenRefCount((TokenRefCount<antlr::Token> *)this_00);
  return (RefAST)other;
}

Assistant:

RefAST ASTFactory::create(RefToken tok)
{
//	cout << "create( tok="<< tok->getType() << ", " << tok->getText() << ")" << nodeFactories.size() << endl;
	RefAST t = nodeFactories[tok->getType()]->second();
	t->initialize(tok);
	return t;
}